

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> * __thiscall
djb::brdf::eval_batch
          (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           *__return_storage_ptr__,brdf *this,
          vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          *io,void *user_args)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference this_00;
  valarray<float> local_50;
  int local_40;
  int i;
  allocator<std::valarray<float>_> local_2a;
  undefined1 local_29;
  void *local_28;
  void *user_args_local;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  *io_local;
  brdf *this_local;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *fr;
  
  local_29 = 0;
  local_28 = user_args;
  user_args_local = io;
  io_local = (vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
              *)this;
  this_local = (brdf *)__return_storage_ptr__;
  sVar2 = std::
          vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          ::size(io);
  std::allocator<std::valarray<float>_>::allocator(&local_2a);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (__return_storage_ptr__,sVar2,&local_2a);
  std::allocator<std::valarray<float>_>::~allocator(&local_2a);
  for (local_40 = 0; iVar1 = local_40,
      sVar2 = std::
              vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
              ::size((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                      *)user_args_local), iVar1 < (int)sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::
             vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
             ::operator[]((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                           *)user_args_local,(long)local_40);
    pvVar4 = std::
             vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
             ::operator[]((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                           *)user_args_local,(long)local_40);
    (**this->_vptr_brdf)(&local_50,this,pvVar3,&pvVar4->second,local_28);
    this_00 = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator[]
                        (__return_storage_ptr__,(long)local_40);
    std::valarray<float>::operator=(this_00,&local_50);
    std::valarray<float>::~valarray(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<brdf::value_type>
brdf::eval_batch(
	const std::vector<brdf::io_pair> &io,
	const void *user_args
) const {
	std::vector<brdf::value_type> fr(io.size());

	for (int i = 0; i < (int)io.size(); ++i) {
		fr[i] = eval(io[i].first, io[i].second, user_args);
	}

	return fr;
}